

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

int event_base_get_npriorities(event_base *base)

{
  int iVar1;
  
  if (base == (event_base *)0x0) {
    base = event_global_current_base_;
  }
  if (base->th_base_lock == (void *)0x0) {
    iVar1 = base->nactivequeues;
  }
  else {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
    iVar1 = base->nactivequeues;
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
    }
  }
  return iVar1;
}

Assistant:

int
event_base_get_npriorities(struct event_base *base)
{

	int n;
	if (base == NULL)
		base = current_base;

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	n = base->nactivequeues;
	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return (n);
}